

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O0

set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *
getDivisors(set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *__return_storage_ptr__
           ,longlong num)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::_Rb_tree_const_iterator<long_long>,_bool> pVar3;
  value_type_conflict local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  long local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  long local_38 [3];
  int local_20;
  undefined1 local_19;
  int i;
  longlong num_local;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *divisors;
  
  local_19 = 0;
  _i = num;
  num_local = (longlong)__return_storage_ptr__;
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set(__return_storage_ptr__)
  ;
  for (local_20 = 1; uVar1 = local_20 * local_20, iVar2 = std::abs((int)_i),
      (long)(ulong)uVar1 <= CONCAT44(extraout_var,iVar2); local_20 = local_20 + 1) {
    if (_i % (long)local_20 == 0) {
      local_38[0] = (long)local_20;
      pVar3 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::insert
                        (__return_storage_ptr__,local_38);
      local_48 = (_Base_ptr)pVar3.first._M_node;
      local_40 = pVar3.second;
      local_50 = _i / (long)local_20;
      pVar3 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::insert
                        (__return_storage_ptr__,&local_50);
      local_60 = (_Base_ptr)pVar3.first._M_node;
      local_58 = pVar3.second;
    }
  }
  iVar2 = std::abs((int)_i);
  local_68 = CONCAT44(extraout_var_00,iVar2);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::insert
            (__return_storage_ptr__,&local_68);
  return __return_storage_ptr__;
}

Assistant:

set<long long int> getDivisors(long long int num) {
    set<long long int> divisors;
    for(int i = 1; i * i <= abs(num); i++) {
        if(num % i == 0) {
            divisors.insert(i);
            divisors.insert(num / i);
        }
    }
    divisors.insert(abs(num));
    return divisors;
}